

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O1

void __thiscall pstore::brokerface::fifo_path::~fifo_path(fifo_path *this)

{
  _Manager_type p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  
  LOCK();
  bVar4 = (this->needs_delete_)._M_base._M_i == true;
  if (bVar4) {
    (this->needs_delete_)._M_base._M_i = false;
  }
  UNLOCK();
  if (bVar4) {
    unlink((this->path_)._M_dataplus._M_p);
  }
  p_Var1 = (this->update_cb_).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->update_cb_,(_Any_data *)&this->update_cb_,__destroy_functor);
  }
  pcVar2 = (this->path_)._M_dataplus._M_p;
  paVar3 = &(this->path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar3) {
    return;
  }
  operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  return;
}

Assistant:

fifo_path::~fifo_path () {
            bool expected = true;
            if (needs_delete_.compare_exchange_strong (expected, false)) {
                ::unlink (path_.c_str ());
            }
        }